

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

wchar_t __thiscall CharConvUTF8::readch(CharConvUTF8 *this,CVmDataSource *src)

{
  int iVar1;
  wchar_t wVar2;
  long *in_RSI;
  size_t len;
  char buf [10];
  ulong local_28;
  char local_1a;
  undefined1 auStack_19 [9];
  long *local_10;
  
  local_10 = in_RSI;
  iVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,&local_1a,1);
  if (iVar1 != 0) {
    err_throw(0);
  }
  local_28 = utf8_ptr::s_charsize(local_1a);
  if (10 < local_28) {
    local_28 = 10;
  }
  if (1 < local_28) {
    iVar1 = (**(code **)(*local_10 + 0x10))(local_10,auStack_19,local_28 - 1);
    if (iVar1 != 0) {
      err_throw(0);
    }
  }
  wVar2 = utf8_ptr::s_getch(&local_1a);
  return wVar2;
}

Assistant:

virtual wchar_t readch(CVmDataSource *src)
    {
        /* read the first byte */
        char buf[10];
        if (src->read(buf, 1))
            err_throw(VMERR_READ_FILE);

        /* figure how many more bytes we have to read */
        size_t len = utf8_ptr::s_charsize(buf[0]);
        if (len > sizeof(buf))
            len = sizeof(buf);

        /* read the rest of the bytes */
        if (len > 1 && src->read(buf+1, len-1))
            err_throw(VMERR_READ_FILE);

        /* return the translated character */
        return utf8_ptr::s_getch(buf);
    }